

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result wabt::ReadBinary(void *data,size_t size,BinaryReaderDelegate *delegate,
                       ReadBinaryOptions *options)

{
  Result RVar1;
  ReadModuleOptions local_129;
  undefined1 local_128 [8];
  BinaryReader reader;
  ReadBinaryOptions *options_local;
  BinaryReaderDelegate *delegate_local;
  size_t size_local;
  void *data_local;
  
  reader.memories.super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)options;
  anon_unknown_24::BinaryReader::BinaryReader((BinaryReader *)local_128,data,size,delegate,options);
  local_129.stop_on_first_error =
       (bool)(*(byte *)((long)&reader.memories.
                               super__Vector_base<wabt::Limits,_std::allocator<wabt::Limits>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage[1].max + 1) & 1);
  RVar1 = anon_unknown_24::BinaryReader::ReadModule((BinaryReader *)local_128,&local_129);
  anon_unknown_24::BinaryReader::~BinaryReader((BinaryReader *)local_128);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinary(const void* data,
                  size_t size,
                  BinaryReaderDelegate* delegate,
                  const ReadBinaryOptions& options) {
  BinaryReader reader(data, size, delegate, options);
  return reader.ReadModule(
      BinaryReader::ReadModuleOptions{options.stop_on_first_error});
}